

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dot.h
# Opt level: O0

RealScalar __thiscall
Eigen::
MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
::norm(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
       *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  RealScalar local_68;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_60;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *this_local;
  RealScalar *local_40;
  RealScalar local_38;
  undefined8 uStack_30;
  RealScalar local_28;
  undefined8 uStack_20;
  RealScalar local_10;
  
  local_60 = this;
  local_68 = squaredNorm(this);
  local_40 = &local_68;
  uStack_20 = 0;
  uStack_30 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_68;
  _this_local = (Packet2d)sqrtpd(auVar1,auVar1);
  local_38 = local_68;
  local_28 = local_68;
  local_10 = local_68;
  dVar2 = internal::pfirst<double__vector(2)>((Packet2d *)&this_local);
  return dVar2;
}

Assistant:

EIGEN_STRONG_INLINE typename NumTraits<typename internal::traits<Derived>::Scalar>::Real MatrixBase<Derived>::norm() const
{
  return numext::sqrt(squaredNorm());
}